

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::SolveBeforeConstraintSyntax::setChild
          (SolveBeforeConstraintSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_00477aa4 + *(int *)(&DAT_00477aa4 + index * 4)))
            (&child,index,in_RDX,&DAT_00477aa4 + *(int *)(&DAT_00477aa4 + index * 4));
  return;
}

Assistant:

void SolveBeforeConstraintSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: solve = child.token(); return;
        case 1: beforeExpr = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 2: before = child.token(); return;
        case 3: afterExpr = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}